

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O3

void gtd_aux(List *code,BOOL *decld,BOOL *any_so_far)

{
  if (code != (List *)0x0) {
    do {
      if (((code->token).type == TOK_TEMP_REGISTER) &&
         (decld[(code->token).u.reginfo.which] == FALSE)) {
        if (*any_so_far == FALSE) {
          fputs("        M68kReg",(FILE *)syn68k_c_stream);
          *any_so_far = TRUE;
        }
        else {
          putc(0x2c,(FILE *)syn68k_c_stream);
        }
        fprintf((FILE *)syn68k_c_stream," tmp%d",(ulong)(code->token).u.reginfo.which);
        decld[(code->token).u.reginfo.which] = TRUE;
      }
      gtd_aux(code->car,decld,any_so_far);
      code = code->cdr;
    } while (code != (ListStruct *)0x0);
  }
  return;
}

Assistant:

static void
gtd_aux (List *code, BOOL *decld, BOOL *any_so_far)
{
  Token *t;

  if (code == NULL)
    return;

  t = &code->token;
  if (t->type == TOK_TEMP_REGISTER)
    {
      if (!decld[t->u.reginfo.which])
	{
	  if (!*any_so_far)
	    {
	      fputs ("        M68kReg", syn68k_c_stream);
	      *any_so_far = TRUE;
	    }
	  else
	    putc (',', syn68k_c_stream);
	  fprintf (syn68k_c_stream, " tmp%d", t->u.reginfo.which);
	  decld[t->u.reginfo.which] = TRUE;
	}
    }

  gtd_aux (code->car, decld, any_so_far);
  gtd_aux (code->cdr, decld, any_so_far);
}